

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.cc
# Opt level: O3

FieldDescriptor * __thiscall
google::protobuf::DescriptorBuilder::OptionInterpreter::AggregateOptionFinder::FindExtension
          (AggregateOptionFinder *this,Message *message,string *name)

{
  anon_union_8_8_13f84498_for_Symbol_2 aVar1;
  long lVar2;
  once_flag *poVar3;
  int iVar4;
  undefined4 extraout_var;
  anon_union_8_8_13f84498_for_Symbol_2 aVar6;
  long lVar7;
  long lVar8;
  Symbol SVar9;
  anon_union_8_8_13f84498_for_Symbol_2 local_40;
  anon_union_8_8_13f84498_for_Symbol_2 local_38;
  long lVar5;
  
  iVar4 = (*(message->super_MessageLite)._vptr_MessageLite[0x15])(message);
  lVar5 = CONCAT44(extraout_var,iVar4);
  SVar9 = LookupSymbolNoPlaceholder(this->builder_,name,*(string **)(lVar5 + 8),LOOKUP_ALL,true);
  aVar6 = SVar9.field_1;
  if (SVar9.type == MESSAGE) {
    if ((*(char *)(*(long *)(lVar5 + 0x20) + 0x48) == '\x01') &&
       (0 < *(int *)(aVar6.descriptor + 0x7c))) {
      lVar7 = 0;
      lVar8 = 0;
      do {
        lVar2 = *(long *)(aVar6.descriptor + 0x50);
        if (*(long *)(lVar2 + 0x50 + lVar7) == lVar5) {
          aVar1.descriptor = (Descriptor *)(lVar2 + lVar7);
          poVar3 = *(once_flag **)(lVar2 + 0x30 + lVar7);
          if (poVar3 != (once_flag *)0x0) {
            local_40.descriptor = (Descriptor *)FieldDescriptor::TypeOnceInit;
            local_38.descriptor = aVar1.descriptor;
            std::
            call_once<void(*)(google::protobuf::FieldDescriptor_const*),google::protobuf::FieldDescriptor_const*>
                      (poVar3,(_func_void_FieldDescriptor_ptr **)&local_40.descriptor,
                       &local_38.field_descriptor);
          }
          if ((*(int *)(lVar2 + 0x38 + lVar7) == 0xb) && (*(int *)(lVar2 + 0x3c + lVar7) == 1)) {
            poVar3 = *(once_flag **)(lVar2 + 0x30 + lVar7);
            if (poVar3 != (once_flag *)0x0) {
              local_40.descriptor = aVar1.descriptor;
              std::
              call_once<void(&)(google::protobuf::FieldDescriptor_const*),google::protobuf::FieldDescriptor_const*>
                        (poVar3,FieldDescriptor::TypeOnceInit,&local_40.field_descriptor);
            }
            if (*(FieldDescriptor **)(lVar2 + 0x68 + lVar7) == (FieldDescriptor *)aVar6.descriptor)
            {
              return (FieldDescriptor *)(Descriptor *)aVar1;
            }
          }
        }
        lVar8 = lVar8 + 1;
        lVar7 = lVar7 + 0x98;
      } while (lVar8 < *(int *)(aVar6.descriptor + 0x7c));
    }
  }
  else if ((SVar9.type == FIELD) &&
          (*(FieldDescriptor *)(aVar6.descriptor + 0x42) != (FieldDescriptor)0x0)) {
    return (FieldDescriptor *)aVar6.descriptor;
  }
  return (FieldDescriptor *)0x0;
}

Assistant:

const FieldDescriptor* FindExtension(Message* message,
                                       const std::string& name) const override {
    assert_mutex_held(builder_->pool_);
    const Descriptor* descriptor = message->GetDescriptor();
    Symbol result =
        builder_->LookupSymbolNoPlaceholder(name, descriptor->full_name());
    if (result.type == Symbol::FIELD &&
        result.field_descriptor->is_extension()) {
      return result.field_descriptor;
    } else if (result.type == Symbol::MESSAGE &&
               descriptor->options().message_set_wire_format()) {
      const Descriptor* foreign_type = result.descriptor;
      // The text format allows MessageSet items to be specified using
      // the type name, rather than the extension identifier. If the symbol
      // lookup returned a Message, and the enclosing Message has
      // message_set_wire_format = true, then return the message set
      // extension, if one exists.
      for (int i = 0; i < foreign_type->extension_count(); i++) {
        const FieldDescriptor* extension = foreign_type->extension(i);
        if (extension->containing_type() == descriptor &&
            extension->type() == FieldDescriptor::TYPE_MESSAGE &&
            extension->is_optional() &&
            extension->message_type() == foreign_type) {
          // Found it.
          return extension;
        }
      }
    }
    return nullptr;
  }